

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::noteLabelName(FunctionValidator *this,Name name)

{
  Name curr;
  __ireturn_type _Var1;
  undefined1 local_28 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_28 = name.super_IString.str._M_len;
  if ((char *)name_local.super_IString.str._M_len != (char *)0x0) {
    _Var1 = std::__detail::
            _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&this->labelNames,(value_type *)local_28);
    curr.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    curr.super_IString.str._M_len = (size_t)local_28;
    shouldBeTrue<wasm::Name>
              (this,(bool)(_Var1.second & 1),curr,
               "names in Binaryen IR must be unique - IR generators must ensure that");
  }
  return;
}

Assistant:

void FunctionValidator::noteLabelName(Name name) {
  if (!name.is()) {
    return;
  }
  auto [_, inserted] = labelNames.insert(name);
  shouldBeTrue(
    inserted,
    name,
    "names in Binaryen IR must be unique - IR generators must ensure that");
}